

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.cpp
# Opt level: O0

void __thiscall
qclab::qgates::Phase<std::complex<double>_>::apply
          (Phase<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int iVar1;
  complex<double> *lambda_00;
  int iVar2;
  undefined4 in_register_00000084;
  double __x;
  double __x_00;
  double __i;
  undefined1 local_50 [8];
  anon_class_24_2_357f297d f;
  complex<double> lambda;
  int qubit;
  int offset_local;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  Phase<std::complex<double>_> *this_local;
  
  iVar2 = offset;
  iVar1 = (*(this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>.
            _vptr_QObject[3])();
  __x_00 = cos(this,__x);
  __i = sin(this,__x_00);
  std::complex<double>::complex((complex<double> *)(f.lambda._M_value + 8),__x_00,__i);
  lambda_00 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::data
                        (vector);
  lambda_Phase<std::complex<double>>
            ((anon_class_24_2_357f297d *)local_50,(qgates *)(ulong)(uint)(int)(char)op,
             (char)&f + 0x10,lambda_00,(complex<double> *)CONCAT44(in_register_00000084,iVar2));
  apply2b<qclab::qgates::lambda_Phase<std::complex<double>>(qclab::Op,std::complex<double>&,std::complex<double>*)::_lambda(unsigned_long)_1_>
            (nbQubits,iVar1 + offset,(anon_class_24_2_357f297d *)local_50);
  return;
}

Assistant:

void Phase< T >::apply( Op op , const int nbQubits ,
                          std::vector< T >& vector , const int offset ) const {
    const int qubit = this->qubit() + offset ;
    T lambda = T( cos() , sin() ) ;
    auto f = lambda_Phase( op , lambda , vector.data() ) ;
    apply2b( nbQubits , qubit , f ) ;
  }